

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

deUint32 vkt::BindingModel::anon_unknown_1::getInterfaceNumResources
                   (ShaderInputInterface shaderInterface)

{
  deUint32 local_c;
  ShaderInputInterface shaderInterface_local;
  
  switch(shaderInterface) {
  case SHADER_INPUT_SINGLE_DESCRIPTOR:
    local_c = 1;
    break;
  case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
    local_c = 2;
    break;
  case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
    local_c = 2;
    break;
  case SHADER_INPUT_DESCRIPTOR_ARRAY:
    local_c = 2;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

deUint32 getInterfaceNumResources (ShaderInputInterface shaderInterface)
{
	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:					return 1u;
		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:		return 2u;
		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:	return 2u;
		case SHADER_INPUT_DESCRIPTOR_ARRAY:						return 2u;

		default:
			DE_FATAL("Impossible");
			return 0u;
	}
}